

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.h
# Opt level: O3

void __thiscall
chrono::ChBodyAuxRef::ChBodyAuxRef
          (ChBodyAuxRef *this,void **vtt,
          shared_ptr<chrono::collision::ChCollisionModel> *new_coll_model)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  shared_ptr<chrono::collision::ChCollisionModel> local_68;
  ChVector<double> local_58;
  ChQuaternion<double> local_38;
  
  local_68.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (new_coll_model->
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_68.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (new_coll_model->
       super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  p_Var1 = (new_coll_model->
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ChBody::ChBody(&this->super_ChBody,vtt + 1,&local_68);
  if (local_68.super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var2;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0xb056f0;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0xb05788;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 6);
  *(void **)(pp_Var2[-3] + -0x78 +
            (long)(&(this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.
                    super_ChFrame<double>.coord + -1) + 0x30) = vtt[7];
  local_38.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_cog,&local_58,&local_38);
  local_38.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->auxref_to_abs,&local_58,&local_38);
  return;
}

Assistant:

ChBodyAuxRef(std::shared_ptr<collision::ChCollisionModel> new_coll_model) : ChBody(new_coll_model) {}